

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O2

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<13,_9,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int in_ECX;
  undefined4 in_register_00000014;
  Matrix<float,_3,_3> *mat;
  Type in0;
  Vector<float,_3> VStack_a8;
  MatrixCaseUtils local_9c [12];
  tcu local_90 [12];
  Mat3 local_84;
  VecAccess<float,_4,_3> local_60;
  Matrix<float,_3,_3> local_44;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<2,9>
              (&local_84,(MatrixCaseUtils *)evalCtx,
               (ShaderEvalContext *)CONCAT44(in_register_00000014,in1Type),in_ECX);
  }
  else {
    tcu::Matrix<float,_3,_3>::Matrix(&local_84,(float *)sr::(anonymous_namespace)::s_constInMat3x3);
  }
  reduceToVec3(local_9c,&local_84);
  sr::(anonymous_namespace)::MatrixCaseUtils::increment<float,3,3>
            (&local_44,(MatrixCaseUtils *)&local_84,mat);
  reduceToVec3((MatrixCaseUtils *)&VStack_a8,&local_44);
  tcu::operator+(local_90,(Vector<float,_3> *)local_9c,&VStack_a8);
  local_60.m_vector = &evalCtx->color;
  local_60.m_index[0] = 0;
  local_60.m_index[1] = 1;
  local_60.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_60,(Vector<float,_3> *)local_90);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);

		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(in0) + reduceToVec3(increment(in0));
	}